

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sliced_Wasserstein.h
# Opt level: O2

double __thiscall
Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance
          (Sliced_Wasserstein *this,Sliced_Wasserstein *second)

{
  undefined1 (*pauVar1) [16];
  double *pdVar2;
  double *pdVar3;
  undefined4 uVar4;
  pointer pvVar5;
  pointer pvVar6;
  undefined1 auVar7 [16];
  double dVar8;
  invalid_argument *this_00;
  uint uVar9;
  size_type __n;
  int i_1;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  int j;
  int iVar13;
  ulong uVar14;
  int i;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  result_type_conflict1 rVar19;
  double dVar20;
  double dVar21;
  int q;
  undefined1 local_1558 [16];
  vector<double,_std::allocator<double>_> v2;
  undefined1 local_1528 [16];
  int p;
  undefined4 uStack_1514;
  pointer ppStack_1510;
  pointer local_1508;
  double theta;
  pointer ppStack_14f0;
  pointer local_14e8;
  vector<int,_std::allocator<int>_> order1;
  int local_14b8;
  Persistence_diagram diagram2;
  Persistence_diagram diagram1;
  vector<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
  angles2;
  vector<int,_std::allocator<int>_> order2;
  vector<int,_std::allocator<int>_> orderp2;
  vector<int,_std::allocator<int>_> orderp1;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm2;
  vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
  anglePerm1;
  default_random_engine re;
  uniform_real_distribution<double> local_13c8;
  vector<double,_std::allocator<double>_> v1;
  
  local_1558._8_8_ = local_1558._0_8_;
  if (this->approx != second->approx) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              (this_00,"Error: different approx values for representations");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&diagram1,&this->diagram);
  std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::vector
            (&diagram2,&second->diagram);
  iVar13 = this->approx;
  if (iVar13 == -1) {
    uVar14 = (ulong)((long)diagram1.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)diagram1.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar16 = (ulong)((long)diagram2.
                           super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)diagram2.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar12 = 0;
    uVar11 = uVar16 & 0xffffffff;
    if ((int)uVar16 < 1) {
      uVar11 = uVar12;
    }
    local_1558._8_8_ = 0x7fefffffffffffff;
    local_1558._0_8_ = 0x7fefffffffffffff;
    local_1528._8_8_ = 0xffefffffffffffff;
    local_1528._0_8_ = 0xffefffffffffffff;
    for (; uVar11 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
      pauVar1 = (undefined1 (*) [16])
                ((long)&(diagram2.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + uVar12);
      auVar7 = *pauVar1;
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((*(double *)(*pauVar1 + 8) + *(double *)*pauVar1) * 0.5);
      v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((*(double *)
                             ((long)&(diagram2.
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first + uVar12) +
                           *(double *)
                            ((long)&(diagram2.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->second + uVar12)) *
                          0.5);
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double,double>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &diagram1,(double *)&v1,(double *)&v2);
      local_1528 = maxpd(auVar7,local_1528);
      local_1558 = minpd(auVar7,local_1558);
    }
    uVar12 = 0;
    uVar11 = uVar14 & 0xffffffff;
    if ((int)uVar14 < 1) {
      uVar11 = uVar12;
    }
    for (; uVar11 * 0x10 != uVar12; uVar12 = uVar12 + 0x10) {
      pauVar1 = (undefined1 (*) [16])
                ((long)&(diagram1.
                         super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->first + uVar12);
      auVar7 = *pauVar1;
      v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((*(double *)(*pauVar1 + 8) + *(double *)*pauVar1) * 0.5);
      v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((*(double *)
                             ((long)&(diagram1.
                                      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->first + uVar12) +
                           *(double *)
                            ((long)&(diagram1.
                                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->second + uVar12)) *
                          0.5);
      std::vector<std::pair<double,double>,std::allocator<std::pair<double,double>>>::
      emplace_back<double,double>
                ((vector<std::pair<double,double>,std::allocator<std::pair<double,double>>> *)
                 &diagram2,(double *)&v1,(double *)&v2);
      local_1528 = maxpd(auVar7,local_1528);
      local_1558 = minpd(auVar7,local_1558);
    }
    uVar12 = (long)diagram1.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)diagram1.
                   super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    std::random_device::random_device((random_device *)&v1);
    uVar11 = std::random_device::_M_getval();
    uVar12 = uVar12 >> 4;
    dVar17 = (double)local_1528._0_8_ - (double)local_1558._0_8_;
    dVar18 = (double)local_1528._8_8_ - (double)local_1558._8_8_;
    lVar15 = 0;
    iVar13 = (int)((uVar11 & 0xffffffff) % 0x7fffffff);
    re._M_x = (unsigned_long)(iVar13 + (uint)(iVar13 == 0));
    local_13c8._M_param._M_a = -1.0;
    local_13c8._M_param._M_b = 1.0;
    local_1558._0_8_ = uVar12;
    uVar11 = 0;
    if (0 < (int)uVar12) {
      uVar11 = uVar12 & 0xffffffff;
    }
    local_14b8 = (int)uVar11;
    for (; uVar11 * 0x10 != lVar15; lVar15 = lVar15 + 0x10) {
      rVar19 = std::uniform_real_distribution<double>::operator()(&local_13c8,&re);
      pdVar3 = (double *)
               ((long)&(diagram1.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar15);
      dVar8 = pdVar3[1];
      dVar20 = rVar19 * dVar17 * 0.0001;
      dVar21 = rVar19 * dVar18 * 0.0001;
      pdVar2 = (double *)
               ((long)&(diagram1.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar15);
      *pdVar2 = *pdVar3 + dVar20;
      pdVar2[1] = dVar8 + dVar21;
      pdVar3 = (double *)
               ((long)&(diagram2.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar15);
      dVar8 = pdVar3[1];
      pdVar2 = (double *)
               ((long)&(diagram2.
                        super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + lVar15);
      *pdVar2 = *pdVar3 + dVar20;
      pdVar2[1] = dVar8 + dVar21;
    }
    v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    angles2.
    super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    angles2.
    super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    angles2.
    super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar13 = 1;
    for (iVar10 = 0; j = iVar13, iVar10 != local_14b8; iVar10 = iVar10 + 1) {
      for (; j < (int)local_1558._0_4_; j = j + 1) {
        orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)compute_angle(this,&diagram1,iVar10,j);
        orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)compute_angle(this,&diagram2,iVar10,j);
        order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar10;
        order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = j;
        std::
        vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
        ::emplace_back<double&,std::pair<int,int>>
                  ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                    *)&v2,(double *)&orderp1,(pair<int,_int> *)&order1);
        order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ = iVar10;
        order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._4_4_ = j;
        std::
        vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
        ::emplace_back<double&,std::pair<int,int>>
                  ((vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>
                    *)&angles2,(double *)&orderp2,(pair<int,_int> *)&order1);
      }
      iVar13 = iVar13 + 1;
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_1_>>
              (v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
               v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<double,std::pair<int,int>>*,std::vector<std::pair<double,std::pair<int,int>>,std::allocator<std::pair<double,std::pair<int,int>>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(std::pair<double,std::pair<int,int>>const&,std::pair<double,std::pair<int,int>>const&)_2_>>
              (angles2.
               super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               angles2.
               super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    for (order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start._0_4_ = 0;
        (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start < (int)local_1558._0_4_;
        order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start._0_4_ =
             (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + 1) {
      std::vector<int,_std::allocator<int>_>::push_back(&orderp1,(value_type_conflict2 *)&order1);
      std::vector<int,_std::allocator<int>_>::push_back(&orderp2,(value_type_conflict2 *)&order1);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_1_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:234:49)>
                )&diagram1);
    std::
    __sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::Persistence_representations::Sliced_Wasserstein::compute_sliced_wasserstein_distance(Gudhi::Persistence_representations::Sliced_Wasserstein_const&)const::_lambda(int,int)_2_>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GUDHI[P]gudhi_devel_src_Persistence_representations_include_gudhi_Sliced_Wasserstein_h:240:49)>
                )&diagram2);
    __n = (size_type)(int)local_1558._0_4_;
    std::vector<int,_std::allocator<int>_>::vector(&order1,__n,(allocator_type *)&order2);
    std::vector<int,_std::allocator<int>_>::vector(&order2,__n,(allocator_type *)&anglePerm1);
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      *(int *)(CONCAT44(order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start) +
              (long)orderp1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar12] * 4) = (int)uVar12;
      order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [orderp2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start[uVar12]] = (int)uVar12;
    }
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::vector(&anglePerm1,__n,(allocator_type *)&anglePerm2);
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::vector(&anglePerm2,__n,(allocator_type *)&theta);
    uVar14 = (ulong)((long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 4;
    uVar16 = 0;
    uVar12 = uVar14 & 0xffffffff;
    if ((int)uVar14 < 1) {
      uVar12 = uVar16;
    }
    for (; uVar12 * 0x10 != uVar16; uVar16 = uVar16 + 0x10) {
      theta = *(double *)
               ((long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar16);
      iVar13 = *(int *)((long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start + uVar16 + 8);
      _p = (pointer)CONCAT44(uStack_1514,iVar13);
      q = *(int *)((long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar16 + 0xc);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (anglePerm1.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)(CONCAT44(order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_start) + (long)iVar13 * 4)),&p,
                 &theta);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (anglePerm1.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)(CONCAT44(order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_start) + (long)q * 4)),&q,&theta
                );
      lVar15 = CONCAT44(order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start._4_4_,
                        (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start);
      uVar4 = *(undefined4 *)(lVar15 + (long)p * 4);
      *(undefined4 *)(lVar15 + (long)p * 4) = *(undefined4 *)(lVar15 + (long)q * 4);
      *(undefined4 *)(lVar15 + (long)q * 4) = uVar4;
    }
    uVar14 = (ulong)((long)angles2.
                           super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)angles2.
                          super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4;
    uVar16 = 0;
    uVar12 = uVar14 & 0xffffffff;
    if ((int)uVar14 < 1) {
      uVar12 = uVar16;
    }
    for (; uVar12 * 0x10 != uVar16; uVar16 = uVar16 + 0x10) {
      theta = *(double *)
               ((long)&(angles2.
                        super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first + uVar16);
      iVar13 = *(int *)((long)&((angles2.
                                 super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->second).first + uVar16)
      ;
      _p = (pointer)CONCAT44(uStack_1514,iVar13);
      q = *(int *)((long)&((angles2.
                            super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->second).second + uVar16);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (anglePerm2.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[iVar13]),&p,&theta);
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double&>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (anglePerm2.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[q]),&q,&theta);
      iVar13 = order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[p];
      order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [p] = order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[q];
      order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [q] = iVar13;
    }
    iVar13 = 0;
    while (_p = (pointer)CONCAT44(uStack_1514,iVar13), iVar13 < (int)local_1558._0_4_) {
      theta = 1.5707963267948966;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (anglePerm1.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 *(int *)(CONCAT44(order1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start._4_4_,
                                   (int)order1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                        .super__Vector_impl_data._M_start) + (long)iVar13 * 4)),&p,
                 &theta);
      theta = 1.5707963267948966;
      std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>::
      emplace_back<int&,double>
                ((vector<std::pair<int,double>,std::allocator<std::pair<int,double>>> *)
                 (anglePerm2.
                  super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start +
                 order2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[p]),&p,&theta);
      iVar13 = p + 1;
    }
    local_1558._0_8_ = 0.0;
    for (uVar12 = 0; uVar12 != uVar11; uVar12 = uVar12 + 1) {
      local_14e8 = (pointer)0x0;
      theta = 0.0;
      ppStack_14f0 = (pointer)0x0;
      local_1508 = (pointer)0x0;
      _p = (pointer)0x0;
      ppStack_1510 = (pointer)0x0;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&theta,
                 anglePerm1.
                 super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)&p,
                 anglePerm2.
                 super__Vector_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar12);
      dVar17 = _p->second;
      uVar9 = 0;
      uVar14 = 0;
      dVar8 = theta;
      dVar18 = theta;
      dVar20 = -1.5707963267948966;
      while( true ) {
        if ((dVar20 == 1.5707963267948966) && (!NAN(dVar20))) break;
        dVar21 = dVar17;
        if (*(double *)((long)dVar18 + 8) <= dVar17) {
          dVar21 = *(double *)((long)dVar18 + 8);
        }
        lVar15 = (ulong)uVar9 * 0x10;
        iVar13 = *(int *)((long)dVar8 + lVar15);
        iVar10 = _p[uVar14].first;
        if ((diagram1.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar13].first !=
             diagram2.
             super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar10].first) ||
           (NAN(diagram1.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar13].first) ||
            NAN(diagram2.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar10].first))) {
LAB_00106a43:
          if ((dVar20 != dVar21) || (NAN(dVar20) || NAN(dVar21))) {
            dVar17 = compute_int(this,dVar20,dVar21,iVar13,iVar10,&diagram1,&diagram2);
            local_1558._0_8_ = (double)local_1558._0_8_ + dVar17;
            dVar8 = theta;
          }
        }
        else if ((diagram1.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar13].second !=
                  diagram2.
                  super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar10].second) ||
                (NAN(diagram1.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar13].second) ||
                 NAN(diagram2.
                     super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar10].second))) goto LAB_00106a43;
        pdVar3 = (double *)((long)dVar8 + 8 + lVar15);
        if ((dVar21 == *pdVar3) && (!NAN(dVar21) && !NAN(*pdVar3))) {
          uVar9 = uVar9 + ((ulong)uVar9 < ((long)ppStack_14f0 - (long)dVar8 >> 4) - 1U);
        }
        dVar17 = _p[uVar14].second;
        if ((dVar21 == dVar17) && (!NAN(dVar21) && !NAN(dVar17))) {
          uVar14 = (ulong)((int)uVar14 + (uint)(uVar14 < ((long)ppStack_1510 - (long)_p >> 4) - 1U))
          ;
          dVar17 = _p[uVar14].second;
        }
        dVar18 = (double)((ulong)uVar9 * 0x10 + (long)dVar8);
        dVar20 = dVar21;
      }
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     *)&p);
      std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
      ~_Vector_base((_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                     *)&theta);
    }
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::~vector(&anglePerm2);
    std::
    vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::~vector(&anglePerm1);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&order2.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&order1.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&orderp2.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&orderp1.super__Vector_base<int,_std::allocator<int>_>);
    std::
    _Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::~_Vector_base(&angles2.
                     super__Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                   );
    std::
    _Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
    ::~_Vector_base((_Vector_base<std::pair<double,_std::pair<int,_int>_>,_std::allocator<std::pair<double,_std::pair<int,_int>_>_>_>
                     *)&v2);
    std::random_device::~random_device((random_device *)&v1);
  }
  else {
    dVar17 = (double)iVar13;
    v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x0;
    local_1558._0_8_ = 0.0;
    for (lVar15 = 0; lVar15 < iVar13; lVar15 = lVar15 + 1) {
      if (v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      if (v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      pvVar5 = (this->projections).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (second->projections_diagonal).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      __merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pvVar5[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pvVar5[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8),
                 pvVar6[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pvVar6[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8),&v1);
      pvVar5 = (second->projections).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pvVar6 = (this->projections_diagonal).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::
      __merge<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,std::back_insert_iterator<std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (pvVar5[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pvVar5[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8),
                 pvVar6[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 *(pointer *)
                  ((long)&pvVar6[lVar15].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8),&v2);
      uVar11 = (ulong)((long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start) >> 3;
      uVar12 = uVar11 & 0xffffffff;
      if ((int)uVar11 < 1) {
        uVar12 = 0;
      }
      dVar18 = 0.0;
      for (uVar11 = 0; uVar12 != uVar11; uVar11 = uVar11 + 1) {
        dVar18 = dVar18 + ABS(v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar11] -
                              v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[uVar11]);
      }
      local_1558._0_8_ = (double)local_1558._0_8_ + dVar18 * (3.141592653589793 / dVar17);
      iVar13 = this->approx;
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v2.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v1.super__Vector_base<double,_std::allocator<double>_>);
  }
  local_1558._0_8_ = (double)local_1558._0_8_ / 3.141592653589793;
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&diagram2.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  std::_Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  ~_Vector_base(&diagram1.
                 super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
               );
  return (double)local_1558._0_8_;
}

Assistant:

double compute_sliced_wasserstein_distance(const Sliced_Wasserstein& second) const {
    GUDHI_CHECK(this->approx == second.approx,
                std::invalid_argument("Error: different approx values for representations"));

    Persistence_diagram diagram1 = this->diagram;
    Persistence_diagram diagram2 = second.diagram;
    double sw = 0;

    if (this->approx == -1) {
      // Add projections onto diagonal.
      int n1, n2;
      n1 = diagram1.size();
      n2 = diagram2.size();
      double min_ordinate = std::numeric_limits<double>::max();
      double min_abscissa = std::numeric_limits<double>::max();
      double max_ordinate = std::numeric_limits<double>::lowest();
      double max_abscissa = std::numeric_limits<double>::lowest();
      for (int i = 0; i < n2; i++) {
        min_ordinate = std::min(min_ordinate, diagram2[i].second);
        min_abscissa = std::min(min_abscissa, diagram2[i].first);
        max_ordinate = std::max(max_ordinate, diagram2[i].second);
        max_abscissa = std::max(max_abscissa, diagram2[i].first);
        diagram1.emplace_back((diagram2[i].first + diagram2[i].second) / 2,
                              (diagram2[i].first + diagram2[i].second) / 2);
      }
      for (int i = 0; i < n1; i++) {
        min_ordinate = std::min(min_ordinate, diagram1[i].second);
        min_abscissa = std::min(min_abscissa, diagram1[i].first);
        max_ordinate = std::max(max_ordinate, diagram1[i].second);
        max_abscissa = std::max(max_abscissa, diagram1[i].first);
        diagram2.emplace_back((diagram1[i].first + diagram1[i].second) / 2,
                              (diagram1[i].first + diagram1[i].second) / 2);
      }
      int num_pts_dgm = diagram1.size();

      // Slightly perturb the points so that the PDs are in generic positions.
      double epsilon = 0.0001;
      double thresh_y = (max_ordinate - min_ordinate) * epsilon;
      double thresh_x = (max_abscissa - min_abscissa) * epsilon;
      std::random_device rd;
      std::default_random_engine re(rd());
      std::uniform_real_distribution<double> uni(-1, 1);
      for (int i = 0; i < num_pts_dgm; i++) {
        double u = uni(re);
        diagram1[i].first += u * thresh_x;
        diagram1[i].second += u * thresh_y;
        diagram2[i].first += u * thresh_x;
        diagram2[i].second += u * thresh_y;
      }

      // Compute all angles in both PDs.
      std::vector<std::pair<double, std::pair<int, int> > > angles1, angles2;
      for (int i = 0; i < num_pts_dgm; i++) {
        for (int j = i + 1; j < num_pts_dgm; j++) {
          double theta1 = compute_angle(diagram1, i, j);
          double theta2 = compute_angle(diagram2, i, j);
          angles1.emplace_back(theta1, std::pair<int, int>(i, j));
          angles2.emplace_back(theta2, std::pair<int, int>(i, j));
        }
      }

      // Sort angles.
      std::sort(angles1.begin(), angles1.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });
      std::sort(angles2.begin(), angles2.end(),
                [](const std::pair<double, std::pair<int, int> >& p1,
                   const std::pair<double, std::pair<int, int> >& p2) { return (p1.first < p2.first); });

      // Initialize orders of the points of both PDs (given by ordinates when theta = -pi/2).
      std::vector<int> orderp1, orderp2;
      for (int i = 0; i < num_pts_dgm; i++) {
        orderp1.push_back(i);
        orderp2.push_back(i);
      }
      std::sort(orderp1.begin(), orderp1.end(), [&](int i, int j) {
        if (diagram1[i].second != diagram1[j].second)
          return (diagram1[i].second < diagram1[j].second);
        else
          return (diagram1[i].first > diagram1[j].first);
      });
      std::sort(orderp2.begin(), orderp2.end(), [&](int i, int j) {
        if (diagram2[i].second != diagram2[j].second)
          return (diagram2[i].second < diagram2[j].second);
        else
          return (diagram2[i].first > diagram2[j].first);
      });

      // Find the inverses of the orders.
      std::vector<int> order1(num_pts_dgm);
      std::vector<int> order2(num_pts_dgm);
      for (int i = 0; i < num_pts_dgm; i++) {
        order1[orderp1[i]] = i;
        order2[orderp2[i]] = i;
      }

      // Record all inversions of points in the orders as theta varies along the positive half-disk.
      std::vector<std::vector<std::pair<int, double> > > anglePerm1(num_pts_dgm);
      std::vector<std::vector<std::pair<int, double> > > anglePerm2(num_pts_dgm);

      int m1 = angles1.size();
      for (int i = 0; i < m1; i++) {
        double theta = angles1[i].first;
        int p = angles1[i].second.first;
        int q = angles1[i].second.second;
        anglePerm1[order1[p]].emplace_back(p, theta);
        anglePerm1[order1[q]].emplace_back(q, theta);
        int a = order1[p];
        int b = order1[q];
        order1[p] = b;
        order1[q] = a;
      }

      int m2 = angles2.size();
      for (int i = 0; i < m2; i++) {
        double theta = angles2[i].first;
        int p = angles2[i].second.first;
        int q = angles2[i].second.second;
        anglePerm2[order2[p]].emplace_back(p, theta);
        anglePerm2[order2[q]].emplace_back(q, theta);
        int a = order2[p];
        int b = order2[q];
        order2[p] = b;
        order2[q] = a;
      }

      for (int i = 0; i < num_pts_dgm; i++) {
        anglePerm1[order1[i]].emplace_back(i, pi / 2);
        anglePerm2[order2[i]].emplace_back(i, pi / 2);
      }

      // Compute the SW distance with the list of inversions.
      for (int i = 0; i < num_pts_dgm; i++) {
        std::vector<std::pair<int, double> > u, v;
        u = anglePerm1[i];
        v = anglePerm2[i];
        double theta1, theta2;
        theta1 = -pi / 2;
        unsigned int ku, kv;
        ku = 0;
        kv = 0;
        theta2 = std::min(u[ku].second, v[kv].second);
        while (theta1 != pi / 2) {
          if (diagram1[u[ku].first].first != diagram2[v[kv].first].first ||
              diagram1[u[ku].first].second != diagram2[v[kv].first].second)
            if (theta1 != theta2) sw += compute_int(theta1, theta2, u[ku].first, v[kv].first, diagram1, diagram2);
          theta1 = theta2;
          if ((theta2 == u[ku].second) && ku < u.size() - 1) ku++;
          if ((theta2 == v[kv].second) && kv < v.size() - 1) kv++;
          theta2 = std::min(u[ku].second, v[kv].second);
        }
      }
    } else {
      double step = pi / this->approx;
      std::vector<double> v1, v2;
      for (int i = 0; i < this->approx; i++) {
        v1.clear();
        v2.clear();
        std::merge(this->projections[i].begin(), this->projections[i].end(), second.projections_diagonal[i].begin(),
                   second.projections_diagonal[i].end(), std::back_inserter(v1));
        std::merge(second.projections[i].begin(), second.projections[i].end(), this->projections_diagonal[i].begin(),
                   this->projections_diagonal[i].end(), std::back_inserter(v2));

        int n = v1.size();
        double f = 0;
        for (int j = 0; j < n; j++) f += std::abs(v1[j] - v2[j]);
        sw += f * step;
      }
    }

    return sw / pi;
  }